

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O0

void __thiscall FTeam::ParseTeamInfo(FTeam *this)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_118 [8];
  FScanner Scan;
  int iLastLump;
  int iLump;
  FTeam *this_local;
  
  Scan.LastGotLine = 0;
  TArray<FTeam,_FTeam>::Clear(&Teams);
  while (Scan._252_4_ = FWadCollection::FindLump(&Wads,"TEAMINFO",&Scan.LastGotLine,false),
        Scan._252_4_ != -1) {
    FScanner::FScanner((FScanner *)local_118,Scan._252_4_);
    while (bVar1 = FScanner::GetString((FScanner *)local_118), bVar1) {
      bVar1 = FScanner::Compare((FScanner *)local_118,"ClearTeams");
      if (bVar1) {
        ClearTeams(this);
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)local_118,"Team");
        if (bVar1) {
          ParseTeamDefinition(this,(FScanner *)local_118);
        }
        else {
          FScanner::ScriptError
                    ((FScanner *)local_118,"ParseTeamInfo: Unknown team command \'%s\'.\n",local_118
                    );
        }
      }
    }
    FScanner::~FScanner((FScanner *)local_118);
  }
  uVar2 = TArray<FTeam,_FTeam>::Size(&Teams);
  if (uVar2 < 2) {
    I_FatalError("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
  }
  else {
    uVar2 = TArray<FTeam,_FTeam>::Size(&Teams);
    if (0x10 < uVar2) {
      I_FatalError("ParseTeamInfo: Too many teams defined. (Maximum: %d)",0x10);
    }
  }
  return;
}

Assistant:

void FTeam::ParseTeamInfo ()
{
	int iLump, iLastLump = 0;

	Teams.Clear();
	while ((iLump = Wads.FindLump ("TEAMINFO", &iLastLump)) != -1)
	{
		FScanner Scan (iLump);

		while (Scan.GetString ())
		{
			if (Scan.Compare ("ClearTeams"))
				ClearTeams ();
			else if (Scan.Compare ("Team"))
				ParseTeamDefinition (Scan);
			else
				Scan.ScriptError ("ParseTeamInfo: Unknown team command '%s'.\n", Scan.String);
		}
	}

	if (Teams.Size () < 2)
		I_FatalError ("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
	else if (Teams.Size () > (unsigned)TEAM_MAXIMUM)
		I_FatalError ("ParseTeamInfo: Too many teams defined. (Maximum: %d)", TEAM_MAXIMUM);
}